

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  ostream *poVar4;
  string local_38;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"samples.xml","");
  read_config_file(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  auVar1 = SEXT816(lVar3 - lVar2) * SEXT816(0x112e0be826d694b3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"All samples done in ",0x14);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,(int)(auVar1._8_8_ >> 0x1a) - (auVar1._12_4_ >> 0x1f));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s, ",3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)((lVar3 - lVar2) / 1000000) % 1000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ms.\n",4);
  return 0;
}

Assistant:

int main() {

  // Initialize rand for non-linux targets
  #ifndef __linux__
    srand(time(nullptr));
  #endif

  std::chrono::time_point<std::chrono::system_clock> start, end;
  start = std::chrono::system_clock::now();

  read_config_file("samples.xml");

  end = std::chrono::system_clock::now();
  int elapsed_s =
      std::chrono::duration_cast<std::chrono::seconds>(end - start).count();
  int elapsed_ms =
      std::chrono::duration_cast<std::chrono::milliseconds>(end - start)
          .count();
  std::cout << "All samples done in " << elapsed_s << "s, " << elapsed_ms % 1000
            << "ms.\n";
}